

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O3

void __thiscall
dg::LLVMDependenceGraph::computeNTSCD
          (LLVMDependenceGraph *this,LLVMControlDependenceAnalysisOptions *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this_00;
  Module *module;
  pointer pcVar2;
  pointer ppVVar3;
  _Base_ptr this_01;
  mapped_type *ppBVar4;
  BBlock<dg::LLVMNode> *pBVar5;
  mapped_type pBVar6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  BasicBlock *pBVar9;
  Value *v;
  Value *dep;
  LLVMControlDependenceAnalysis ntscd;
  mapped_type local_170;
  mapped_type local_168;
  _Rb_tree_node_base *local_160;
  mapped_type local_158;
  ValVec local_150;
  _Base_ptr local_138;
  key_type local_130;
  _Rb_tree_node_base *local_128;
  long local_120;
  long local_118;
  _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
  *local_110;
  LLVMControlDependenceAnalysis local_108;
  LLVMControlDependenceAnalysisOptions local_90;
  
  module = this->module;
  paVar1 = &local_90.super_LLVMAnalysisOptions.entryFunction.field_2;
  pcVar2 = (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p;
  local_90.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,
             pcVar2 + (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length);
  local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset =
       (opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.fieldSensitivity.offset;
  this_00 = &local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
             allocationFunctions;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&this_00->_M_t,
             &(opts->super_ControlDependenceAnalysisOptions).super_AnalysisOptions.
              allocationFunctions._M_t);
  local_90.super_ControlDependenceAnalysisOptions.interprocedural =
       (opts->super_ControlDependenceAnalysisOptions).interprocedural;
  local_90.super_ControlDependenceAnalysisOptions.algorithm =
       (opts->super_ControlDependenceAnalysisOptions).algorithm;
  local_90.super_ControlDependenceAnalysisOptions._61_2_ =
       *(undefined2 *)&(opts->super_ControlDependenceAnalysisOptions).field_0x3d;
  LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
            (&local_108,module,&local_90,(LLVMPointerAnalysis *)0x0);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&this_00->_M_t,
             (_Link_type)
             local_90.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
             allocationFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                    local_90.super_LLVMAnalysisOptions.entryFunction.field_2._M_allocated_capacity +
                    1);
  }
  local_128 = (_Rb_tree_node_base *)(constructedFunctions + 8);
  p_Var7 = (_Rb_tree_node_base *)constructedFunctions._24_8_;
  if (constructedFunctions._24_8_ != 0x120928) {
    do {
      lVar8 = *(long *)(*(long *)(p_Var7 + 1) + 0x50);
      local_120 = *(long *)(p_Var7 + 1) + 0x48;
      local_160 = p_Var7;
      if (lVar8 != local_120) {
        local_138 = p_Var7[1]._M_parent + 3;
        do {
          pBVar9 = (BasicBlock *)(lVar8 + -0x18);
          if (lVar8 == 0) {
            pBVar9 = (BasicBlock *)0x0;
          }
          local_150.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pBVar9;
          local_118 = lVar8;
          ppBVar4 = std::
                    map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                    ::operator[]((map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                                  *)local_138,(key_type *)&local_150);
          local_168 = *ppBVar4;
          local_158 = (mapped_type)pBVar9;
          LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
                    (&local_150,&local_108,pBVar9);
          this_01 = local_138;
          ppVVar3 = local_150.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (local_150.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_150.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_110 = (_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                         *)&local_168->revControlDeps;
            pBVar9 = (BasicBlock *)
                     local_150.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              local_130 = *(key_type *)pBVar9;
              ppBVar4 = std::
                        map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                        ::operator[]((map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                                      *)this_01,&local_130);
              pBVar6 = *ppBVar4;
              local_170 = local_168;
              std::
              _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
              ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                        ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                          *)&pBVar6->controlDeps,&local_170);
              local_170 = pBVar6;
              std::
              _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
              ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>(local_110,&local_170);
              pBVar9 = pBVar9 + 8;
            } while (pBVar9 != (BasicBlock *)ppVVar3);
          }
          if ((BasicBlock *)
              local_150.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_start != (BasicBlock *)0x0) {
            operator_delete(local_150.
                            super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_150.
                                  super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_150.
                                  super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pBVar6 = *(mapped_type *)((long)local_158 + 0x30);
          local_158 = (mapped_type)((long)local_158 + 0x28);
          if (pBVar6 != local_158) {
            do {
              v = (Value *)&pBVar6[-1].callSites._M_t._M_impl.super__Rb_tree_header._M_node_count;
              if (pBVar6 == (mapped_type)0x0) {
                v = (Value *)0x0;
              }
              local_168 = pBVar6;
              LLVMControlDependenceAnalysis::_getDependencies<llvm::Instruction_const*>
                        (&local_150,&local_108,(Instruction *)v);
              ppVVar3 = local_150.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              p_Var7 = local_160;
              for (pBVar9 = (BasicBlock *)
                            local_150.
                            super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pBVar9 != (BasicBlock *)ppVVar3; pBVar9 = pBVar9 + 8) {
                pBVar5 = (BBlock<dg::LLVMNode> *)
                         DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                                   ((DependenceGraph<dg::LLVMNode> *)p_Var7[1]._M_parent,
                                    *(Value **)pBVar9);
                pBVar6 = (mapped_type)
                         DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                                   ((DependenceGraph<dg::LLVMNode> *)p_Var7[1]._M_parent,v);
                local_170 = pBVar5;
                std::
                _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                ::_M_insert_unique<dg::LLVMNode*const&>
                          ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                            *)&(pBVar6->revControlDeps).
                               super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
                               _M_impl.super__Rb_tree_header._M_header._M_left,
                           (LLVMNode **)&local_170);
                local_170 = pBVar6;
                std::
                _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                ::_M_insert_unique<dg::LLVMNode*const&>
                          ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                            *)&pBVar5->nodes,(LLVMNode **)&local_170);
              }
              if ((BasicBlock *)
                  local_150.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                  _M_impl.super__Vector_impl_data._M_start != (BasicBlock *)0x0) {
                operator_delete(local_150.
                                super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_150.
                                      super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_150.
                                      super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pBVar6 = (mapped_type)local_168->dg;
            } while (pBVar6 != local_158);
          }
          lVar8 = *(long *)(local_118 + 8);
        } while (lVar8 != local_120);
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_160);
    } while (p_Var7 != local_128);
  }
  if ((_Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>)
      local_108._interprocImpl._M_t.
      super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
      .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl !=
      (_Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_108._interprocImpl._M_t.
        super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
        .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl)[1])();
  }
  local_108._interprocImpl._M_t.
  super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>,_true,_true>
        )(__uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
          )0x0;
  if (local_108._impl._M_t.
      super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
      .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
       )0x0) {
    (**(code **)(*(long *)local_108._impl._M_t.
                          super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
                          .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>.
                          _M_head_impl + 8))();
  }
  local_108._impl._M_t.
  super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
  .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>,_true,_true>
        )(__uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
          )0x0;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&local_108._options.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t,
             (_Link_type)
             local_108._options.super_ControlDependenceAnalysisOptions.super_AnalysisOptions.
             allocationFunctions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._options.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p !=
      &local_108._options.super_LLVMAnalysisOptions.entryFunction.field_2) {
    operator_delete(local_108._options.super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p,
                    local_108._options.super_LLVMAnalysisOptions.entryFunction.field_2.
                    _M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LLVMDependenceGraph::computeNTSCD(
        const LLVMControlDependenceAnalysisOptions &opts) {
    DBG_SECTION_BEGIN(llvmdg, "Filling in CDA edges (NTSCD)");
    dg::LLVMControlDependenceAnalysis ntscd(this->module, opts);
    assert(opts.ntscdCD() || opts.ntscd2CD());

    for (const auto &it : getConstructedFunctions()) {
        auto &blocks = it.second->getBlocks();
        for (auto &BB : *llvm::cast<llvm::Function>(it.first)) {
            auto *bb = blocks[&BB];
            assert(bb);
            for (auto *dep : ntscd.getDependencies(&BB)) {
                auto *depbb = blocks[dep];
                assert(depbb);
                depbb->addControlDependence(bb);
            }

            for (auto &I : BB) {
                for (auto *dep : ntscd.getDependencies(&I)) {
                    auto *depnd = it.second->getNode(dep);
                    assert(depnd);
                    auto *ind = it.second->getNode(&I);
                    assert(ind);
                    depnd->addControlDependence(ind);
                }
            }
        }
    }

    DBG_SECTION_END(llvmdg, "Done computing CDA edges");
}